

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall duckdb_re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  uint uVar1;
  Inst *pIVar2;
  Frag FVar3;
  Frag FVar4;
  uint local_50;
  uint uStack_4c;
  uint local_48;
  int iStack_44;
  uint32_t local_40;
  uint uStack_3c;
  
  if (((undefined1  [16])a & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    local_50 = AllocInst(this,1);
    if ((int)local_50 < 0) {
      local_50 = 0;
      uStack_4c = 0;
      local_48 = 0;
      iStack_44 = (uint)iStack_44._1_3_ << 8;
    }
    else {
      pIVar2 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + local_50;
      local_40 = a.begin;
      uStack_4c = local_50 * 2;
      if (nongreedy) {
        Prog::Inst::InitAlt(pIVar2,0,local_40);
      }
      else {
        Prog::Inst::InitAlt(pIVar2,local_40,0);
        uStack_4c = uStack_4c | 1;
      }
      uStack_3c = a.end.head;
      if (uStack_3c != 0) {
        pIVar2 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        do {
          uVar1 = uStack_3c >> 1;
          if ((uStack_3c & 1) == 0) {
            uStack_3c = pIVar2[uVar1].out_opcode_ >> 4;
            pIVar2[uVar1].out_opcode_ = pIVar2[uVar1].out_opcode_ & 0xf | local_50 << 4;
          }
          else {
            uStack_3c = pIVar2[uVar1].field_1.out1_;
            pIVar2[uVar1].field_1.cap_ = local_50;
          }
        } while (uStack_3c != 0);
      }
      iStack_44 = CONCAT31(iStack_44._1_3_,1);
      local_48 = uStack_4c;
    }
  }
  else {
    FVar3 = Plus(this,a,nongreedy);
    FVar4._8_8_ = FVar3._8_8_ & 0xffffffffff;
    FVar4.begin = (int)FVar3._0_8_;
    FVar4.end.head = (int)((ulong)FVar3._0_8_ >> 0x20);
    FVar4 = Quest(this,FVar4,nongreedy);
    local_50 = FVar4.begin;
    uStack_4c = FVar4.end.head;
    local_48 = FVar4.end.tail;
    iStack_44 = CONCAT31(iStack_44._1_3_,FVar4.nullable);
  }
  FVar3.end.head = uStack_4c;
  FVar3.begin = local_50;
  FVar3.end.tail = local_48;
  FVar3._12_4_ = iStack_44;
  return FVar3;
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  // When the subexpression is nullable, one Alt isn't enough to guarantee
  // correct priority ordering within the transitive closure. The simplest
  // solution is to handle it as (a+)? instead, which adds the second Alt.
  if (a.nullable)
    return Quest(Plus(a, nongreedy), nongreedy);

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(id, pl, true);
}